

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_LIT(Context *ctx)

{
  char local_d8 [8];
  char code [128];
  char src0 [64];
  Context *ctx_local;
  
  make_GLSL_srcarg_string_full(ctx,0,code + 0x78,0x40);
  emit_GLSL_LIT_helper(ctx);
  make_GLSL_destarg_assign(ctx,local_d8,0x80,"LIT(%s)",code + 0x78);
  output_line(ctx,"%s",local_d8);
  return;
}

Assistant:

static void emit_GLSL_LIT(Context *ctx)
{
    char src0[64]; make_GLSL_srcarg_string_full(ctx, 0, src0, sizeof (src0));
    char code[128];
    emit_GLSL_LIT_helper(ctx);
    make_GLSL_destarg_assign(ctx, code, sizeof (code), "LIT(%s)", src0);
    output_line(ctx, "%s", code);
}